

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupDfsLitArray(Gia_Man_t *p,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  long lVar12;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e4a05;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_001e4a24:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_001e4a24;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pVVar10 = p->vCis;
    } while (lVar12 < pVVar10->nSize);
  }
  if (0 < vLits->nSize) {
    lVar12 = 0;
    do {
      uVar2 = vLits->pArray[lVar12];
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->nObjs <= (int)(uVar2 >> 1)) {
LAB_001e4a05:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar7 = Gia_ManDupDfs2_rec(p_00,p,p->pObjs + (uVar2 >> 1));
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar7 ^ uVar2 & 1);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vLits->nSize);
  }
  Gia_ManSetRegNum(p_00,0);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsLitArray( Gia_Man_t * p, Vec_Int_t * vLits )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, iLit, iLitRes;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_IntForEachEntry( vLits, iLit, i )
    {
        iLitRes = Gia_ManDupDfs2_rec( pNew, p, Gia_ManObj(p, Abc_Lit2Var(iLit)) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond( iLitRes, Abc_LitIsCompl(iLit)) );
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}